

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::ScrollIntoView(Element *this,ScrollIntoViewOptions options)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  ulong uVar4;
  Vector2f VVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Element *this_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float local_68;
  float fStack_64;
  float local_48;
  
  uVar6 = options._8_8_;
  VVar5 = Box::GetSize(&this->main_box,Border);
  uVar7 = uVar6 & 0xffffffff00000000;
  this_00 = this;
  do {
    while( true ) {
      this_00 = this_00->parent;
      if (this_00 == (Element *)0x0) {
        return;
      }
      uVar4 = *(ulong *)&(this_00->meta->computed_values).common;
      fVar9 = GetScrollWidth(this_00);
      fVar10 = GetScrollHeight(this_00);
      fVar11 = GetClientWidth(this_00);
      fVar12 = GetClientHeight(this_00);
      uVar8 = (uint)uVar4;
      if ((((byte)(uVar4 >> 0xb) & fVar11 < fVar9) != 0) ||
         (((byte)(uVar4 >> 0xd) & fVar12 < fVar10) != 0)) {
        UpdateAbsoluteOffsetAndRenderBoxData(this_00);
        VVar1 = this_00->absolute_offset;
        UpdateAbsoluteOffsetAndRenderBoxData(this);
        VVar2 = this->absolute_offset;
        VVar3 = this_00->scroll_offset;
        fVar10 = GetClientLeft(this_00);
        fVar9 = GetClientTop(this_00);
        fVar13 = 0.0;
        if ((uVar8 >> 0xb & 1) != 0) {
          local_98 = VVar1.x;
          local_68 = VVar2.x;
          fVar10 = fVar10 - (local_98 - local_68);
          local_48 = VVar5.x;
          fVar13 = GetScrollOffsetDelta(options.horizontal,fVar10,(local_48 + fVar10) - fVar11);
        }
        fVar10 = 0.0;
        if ((uVar8 >> 0xd & 1) != 0) {
          fStack_94 = VVar1.y;
          fStack_64 = VVar2.y;
          fVar9 = fVar9 - (fStack_94 - fStack_64);
          fVar10 = GetScrollOffsetDelta(options.vertical,fVar9,(VVar5.y + fVar9) - fVar12);
        }
        local_88 = VVar3.x;
        fStack_84 = VVar3.y;
        VVar1.y = fStack_84 + fVar10;
        VVar1.x = local_88 + fVar13;
        ScrollTo(this_00,VVar1,(ScrollBehavior)uVar6);
        uVar6 = 2;
      }
      if ((uVar8 >> 0xb & 1) != 0) break;
      if (((byte)(uVar8 >> 0xd) & uVar7 == 0x100000000) != 0) {
        return;
      }
    }
  } while (uVar7 != 0x100000000);
  return;
}

Assistant:

void Element::ScrollIntoView(const ScrollIntoViewOptions options)
{
	const Vector2f size = main_box.GetSize(BoxArea::Border);
	ScrollBehavior scroll_behavior = options.behavior;

	for (Element* scroll_parent = parent; scroll_parent; scroll_parent = scroll_parent->GetParentNode())
	{
		using Style::Overflow;
		const ComputedValues& computed = scroll_parent->GetComputedValues();
		const bool scrollable_box_x = (computed.overflow_x() != Overflow::Visible && computed.overflow_x() != Overflow::Hidden);
		const bool scrollable_box_y = (computed.overflow_y() != Overflow::Visible && computed.overflow_y() != Overflow::Hidden);

		const Vector2f parent_scroll_size = {scroll_parent->GetScrollWidth(), scroll_parent->GetScrollHeight()};
		const Vector2f parent_client_size = {scroll_parent->GetClientWidth(), scroll_parent->GetClientHeight()};

		if ((scrollable_box_x && parent_scroll_size.x > parent_client_size.x) || (scrollable_box_y && parent_scroll_size.y > parent_client_size.y))
		{
			const Vector2f relative_offset = scroll_parent->GetAbsoluteOffset(BoxArea::Border) - GetAbsoluteOffset(BoxArea::Border);

			const Vector2f old_scroll_offset = {scroll_parent->GetScrollLeft(), scroll_parent->GetScrollTop()};
			const Vector2f parent_client_offset = {scroll_parent->GetClientLeft(), scroll_parent->GetClientTop()};

			const Vector2f delta_scroll_offset_start = parent_client_offset - relative_offset;
			const Vector2f delta_scroll_offset_end = delta_scroll_offset_start + size - parent_client_size;

			Vector2f scroll_delta = {
				scrollable_box_x ? GetScrollOffsetDelta(options.horizontal, delta_scroll_offset_start.x, delta_scroll_offset_end.x) : 0.f,
				scrollable_box_y ? GetScrollOffsetDelta(options.vertical, delta_scroll_offset_start.y, delta_scroll_offset_end.y) : 0.f,
			};

			scroll_parent->ScrollTo(old_scroll_offset + scroll_delta, scroll_behavior);

			// Currently, only a single scrollable parent can be smooth scrolled at a time, so any other parents must be instant scrolled.
			scroll_behavior = ScrollBehavior::Instant;
		}

		if ((scrollable_box_x || scrollable_box_y) && options.parentage == ScrollParentage::Closest)
			break;
	}
}